

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_link.c
# Opt level: O0

void * metacall_link_hook(void *handle,char *symbol)

{
  _func_void *p_Var1;
  set_value pvVar2;
  undefined8 in_RSI;
  set_key in_RDI;
  void *ptr;
  metacall_link_func_ptr metacall_link_trampoline;
  set in_stack_fffffffffffffff8;
  
  threading_mutex_lock((threading_mutex)0x13b82a);
  p_Var1 = detour_trampoline(detour_link_handle);
  pvVar2 = set_get(in_stack_fffffffffffffff8,in_RDI);
  threading_mutex_unlock((threading_mutex)0x13b85c);
  if (pvVar2 == (set_value)0x0) {
    pvVar2 = (set_value)(*p_Var1)(in_RDI,in_RSI);
  }
  return pvVar2;
}

Assistant:

void *metacall_link_hook(void *handle, const char *symbol)
{
	typedef void *(*metacall_link_func_ptr)(void *, const char *);

	metacall_link_func_ptr metacall_link_trampoline;

	void *ptr;

	threading_mutex_lock(&link_mutex);

	metacall_link_trampoline = (metacall_link_func_ptr)detour_trampoline(detour_link_handle);

	/* Intercept function if any */
	ptr = set_get(metacall_link_table, (set_key)symbol);

	/* TODO: Disable logs here until log is completely thread safe and async signal safe */
	/* log_write("metacall", LOG_LEVEL_DEBUG, "MetaCall detour link interception: %s -> %p", symbol, ptr); */

	threading_mutex_unlock(&link_mutex);

	if (ptr != NULL)
	{
		return ptr;
	}

	return metacall_link_trampoline(handle, symbol);
}